

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O0

void anon_unknown.dwarf_2fa16::assert_in_msg(void)

{
  initializer_list<int> __l;
  string expected;
  string msg;
  TestFailure *e;
  string local_c0 [32];
  Assert local_a0;
  allocator local_89;
  string local_88 [32];
  Assert local_68 [2];
  allocator<int> local_41;
  int local_40 [4];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> v;
  
  local_40[0] = 0;
  local_40[1] = 1;
  local_40[2] = 2;
  local_40[3] = 3;
  local_30 = local_40;
  local_28 = 4;
  std::allocator<int>::allocator(&local_41);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,__l,&local_41);
  std::allocator<int>::~allocator(&local_41);
  UnitTests::Assert::Assert
            (local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
             ,0x119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Extra message",&local_89);
  UnitTests::Assert::In<int,std::vector<int,std::allocator<int>>&>
            (local_68,(string *)local_88,10,(vector<int,_std::allocator<int>_> *)local_20);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  UnitTests::Assert::Assert
            (&local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
             ,0x11a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c0,"ASSERT_IN should have fired here.",(allocator *)((long)&e + 7));
  UnitTests::Assert::Fail(&local_a0,(string *)local_c0);
}

Assistant:

TEST(assert_in_msg)
    {
        try
        {
            std::vector<int> v{0, 1, 2, 3};
            ASSERT_IN("Extra message", 10, v);
            FAIL("ASSERT_IN should have fired here.");
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg = e.what();
            std::string expected =
                "error A1000: Assertion failure : Extra message. Expected container to contain 10, actual contents :\n"
                "\t[0, 1, 2, 3]";
            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_IN", __FILE__, __LINE__);
            }
        }
    }